

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<TCBPoint>::detachAndGrow
          (QArrayDataPointer<TCBPoint> *this,GrowthPosition where,qsizetype n,TCBPoint **data,
          QArrayDataPointer<TCBPoint> *old)

{
  bool bVar1;
  qsizetype qVar2;
  long in_RDX;
  int in_ESI;
  TCBPoint **in_RDI;
  QArrayDataPointer<TCBPoint> *in_R8;
  qsizetype unaff_retaddr;
  bool readjusted;
  GrowthPosition in_stack_0000000c;
  bool detach;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  bool bVar3;
  undefined1 in_stack_ffffffffffffffd7;
  
  bVar1 = needsDetach((QArrayDataPointer<TCBPoint> *)
                      CONCAT17(in_stack_ffffffffffffffd7,
                               CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  bVar3 = false;
  if (!bVar1) {
    if (in_RDX == 0) {
      return;
    }
    if ((in_ESI == 1) && (qVar2 = freeSpaceAtBegin(in_R8), in_RDX <= qVar2)) {
      return;
    }
    if ((in_ESI == 0) && (qVar2 = freeSpaceAtEnd(in_R8), in_RDX <= qVar2)) {
      return;
    }
    bVar3 = tryReadjustFreeSpace(old,in_stack_0000000c,unaff_retaddr,in_RDI);
  }
  if (bVar3 == false) {
    reallocateAndGrow(this,where,n,(QArrayDataPointer<TCBPoint> *)data);
  }
  return;
}

Assistant:

void detachAndGrow(QArrayData::GrowthPosition where, qsizetype n, const T **data,
                       QArrayDataPointer *old)
    {
        const bool detach = needsDetach();
        bool readjusted = false;
        if (!detach) {
            if (!n || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n))
                return;
            readjusted = tryReadjustFreeSpace(where, n, data);
            Q_ASSERT(!readjusted
                     || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                     || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n));
        }

        if (!readjusted)
            reallocateAndGrow(where, n, old);
    }